

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_os_tmpdir(char *buffer,size_t *size)

{
  size_t local_30;
  size_t len;
  char *buf;
  size_t *size_local;
  char *buffer_local;
  
  if (((buffer == (char *)0x0) || (size == (size_t *)0x0)) || (*size == 0)) {
    buffer_local._4_4_ = -0x16;
  }
  else {
    len = (size_t)getenv("TMPDIR");
    if ((((char *)len == (char *)0x0) && (len = (size_t)getenv("TMP"), (char *)len == (char *)0x0))
       && ((len = (size_t)getenv("TEMP"), (char *)len == (char *)0x0 &&
           (len = (size_t)getenv("TEMPDIR"), (char *)len == (char *)0x0)))) {
      len = (size_t)anon_var_dwarf_aaeab;
    }
    local_30 = strlen((char *)len);
    if (local_30 < *size) {
      if ((1 < local_30) && (*(char *)(len + (local_30 - 1)) == '/')) {
        local_30 = local_30 - 1;
      }
      memcpy(buffer,(void *)len,local_30 + 1);
      buffer[local_30] = '\0';
      *size = local_30;
      buffer_local._4_4_ = 0;
    }
    else {
      *size = local_30 + 1;
      buffer_local._4_4_ = -0x69;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_os_tmpdir(char* buffer, size_t* size) {
  const char* buf;
  size_t len;

  if (buffer == NULL || size == NULL || *size == 0)
    return UV_EINVAL;

#define CHECK_ENV_VAR(name)                                                   \
  do {                                                                        \
    buf = getenv(name);                                                       \
    if (buf != NULL)                                                          \
      goto return_buffer;                                                     \
  }                                                                           \
  while (0)

  /* Check the TMPDIR, TMP, TEMP, and TEMPDIR environment variables in order */
  CHECK_ENV_VAR("TMPDIR");
  CHECK_ENV_VAR("TMP");
  CHECK_ENV_VAR("TEMP");
  CHECK_ENV_VAR("TEMPDIR");

#undef CHECK_ENV_VAR

  /* No temp environment variables defined */
  #if defined(__ANDROID__)
    buf = "/data/local/tmp";
  #else
    buf = "/tmp";
  #endif

return_buffer:
  len = strlen(buf);

  if (len >= *size) {
    *size = len + 1;
    return UV_ENOBUFS;
  }

  /* The returned directory should not have a trailing slash. */
  if (len > 1 && buf[len - 1] == '/') {
    len--;
  }

  memcpy(buffer, buf, len + 1);
  buffer[len] = '\0';
  *size = len;

  return 0;
}